

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O1

void conn_report_connect_stats(Curl_easy *data,connectdata *conn)

{
  Curl_cfilter *pCVar1;
  curltime timestamp;
  curltime timestamp_00;
  curltime appconnected;
  curltime connected;
  long local_38;
  int iStack_30;
  undefined4 uStack_2c;
  long local_28;
  int iStack_20;
  undefined4 uStack_1c;
  
  pCVar1 = conn->cfilter[0];
  if (pCVar1 != (Curl_cfilter *)0x0) {
    local_28 = 0;
    iStack_20 = 0;
    uStack_1c = 0;
    (*pCVar1->cft->query)(pCVar1,data,4,(int *)0x0,&local_28);
    timestamp.tv_usec = iStack_20;
    timestamp.tv_sec = local_28;
    if (iStack_20 != 0 || local_28 != 0) {
      timestamp._12_4_ = 0;
      Curl_pgrsTimeWas(data,TIMER_CONNECT,timestamp);
    }
    local_38 = 0;
    iStack_30 = 0;
    uStack_2c = 0;
    (*pCVar1->cft->query)(pCVar1,data,5,(int *)0x0,&local_38);
    timestamp_00.tv_usec = iStack_30;
    timestamp_00.tv_sec = local_38;
    if (iStack_30 != 0 || local_38 != 0) {
      timestamp_00._12_4_ = 0;
      Curl_pgrsTimeWas(data,TIMER_APPCONNECT,timestamp_00);
    }
  }
  return;
}

Assistant:

static void conn_report_connect_stats(struct Curl_easy *data,
                                      struct connectdata *conn)
{
  struct Curl_cfilter *cf = conn->cfilter[FIRSTSOCKET];
  if(cf) {
    struct curltime connected;
    struct curltime appconnected;

    memset(&connected, 0, sizeof(connected));
    cf->cft->query(cf, data, CF_QUERY_TIMER_CONNECT, NULL, &connected);
    if(connected.tv_sec || connected.tv_usec)
      Curl_pgrsTimeWas(data, TIMER_CONNECT, connected);

    memset(&appconnected, 0, sizeof(appconnected));
    cf->cft->query(cf, data, CF_QUERY_TIMER_APPCONNECT, NULL, &appconnected);
    if(appconnected.tv_sec || appconnected.tv_usec)
      Curl_pgrsTimeWas(data, TIMER_APPCONNECT, appconnected);
  }
}